

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

void __thiscall helics::ActionMessage::setString(ActionMessage *this,int index,string_view str)

{
  pointer pbVar1;
  invalid_argument *this_00;
  string_view str_local;
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  if ((uint)index < 0xff) {
    pbVar1 = (this->stringData).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->stringData).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5) <=
        index) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->stringData,(ulong)(index + 1));
      pbVar1 = (this->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)(pbVar1 + (uint)index),
               (basic_string_view<char,_std::char_traits<char>_> *)&str_local);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"index out of specified range (0-254)");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ActionMessage::setString(int index, std::string_view str)
{
    if (index >= 255 || index < 0) {
        throw(std::invalid_argument("index out of specified range (0-254)"));
    }
    if (index >= static_cast<int>(stringData.size())) {
        stringData.resize(static_cast<size_t>(index) + 1);
    }
    stringData[index] = str;
}